

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::LatticeImpl::clear(LatticeImpl *this)

{
  Allocator<mecab_node_t,_mecab_path_t> *this_00;
  StringBuffer *pSVar1;
  void *in_RSI;
  long in_RDI;
  
  this_00 = scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_>::operator->
                      ((scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 200));
  Allocator<mecab_node_t,_mecab_path_t>::free(this_00,in_RSI);
  pSVar1 = scoped_ptr<MeCab::StringBuffer>::get((scoped_ptr<MeCab::StringBuffer> *)(in_RDI + 0xb8));
  if (pSVar1 != (StringBuffer *)0x0) {
    pSVar1 = scoped_ptr<MeCab::StringBuffer>::operator->
                       ((scoped_ptr<MeCab::StringBuffer> *)(in_RDI + 0xb8));
    StringBuffer::clear(pSVar1);
  }
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::clear
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)0x1a2905);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::clear
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)0x1a2913);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1a2924);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a2935);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0x3fe8000000000000;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

void LatticeImpl::clear() {
  allocator_->free();
  if (ostrs_.get()) {
    ostrs_->clear();
  }
  begin_nodes_.clear();
  end_nodes_.clear();
  feature_constraint_.clear();
  boundary_constraint_.clear();
  size_ = 0;
  theta_ = kDefaultTheta;
  Z_ = 0.0;
  sentence_ = 0;
}